

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeUniqueCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  uint16_t *puVar4;
  int64_t iVar5;
  uint32_t t;
  uint32_t s;
  uint32_t lower32;
  uint32_t p;
  int64_t ce;
  int32_t i;
  uint32_t ter;
  uint32_t sec;
  uint32_t pri;
  uint32_t prevSecondary;
  uint32_t prevPrimary;
  uint32_t lastGroupPrimary;
  int32_t group;
  UErrorCode *errorCode_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uprv_free_63(this->miniCEs);
    iVar2 = UVector64::size(&this->uniqueCEs);
    puVar4 = (uint16_t *)uprv_malloc_63((long)(iVar2 << 1));
    this->miniCEs = puVar4;
    if (this->miniCEs == (uint16_t *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      prevPrimary = 0;
      prevSecondary = this->lastSpecialPrimaries[0];
      pri = 0;
      sec = 0;
      ter = 0;
      i = 0;
      ce._4_4_ = 0;
      for (ce._0_4_ = 0; iVar2 = UVector64::size(&this->uniqueCEs), (int)ce < iVar2;
          ce._0_4_ = (int)ce + 1) {
        iVar5 = UVector64::elementAti(&this->uniqueCEs,(int)ce);
        uVar3 = (uint)((ulong)iVar5 >> 0x20);
        if (uVar3 == pri) {
LAB_00290754:
          uVar3 = (uint)iVar5 >> 0x10;
          if (uVar3 != sec) {
            if (ter == 0) {
              if (i == 0) {
                i = 0x180;
              }
              else {
                if (0x3df < (uint)i) {
                  this->miniCEs[(int)ce] = 1;
                  goto LAB_0029090b;
                }
                i = i + 0x20;
              }
            }
            else if (uVar3 < 0x500) {
              if (i == 0xa0) {
                i = 0;
              }
              else {
                if (0x7f < (uint)i) {
                  this->miniCEs[(int)ce] = 1;
                  goto LAB_0029090b;
                }
                i = i + 0x20;
              }
            }
            else if (uVar3 == 0x500) {
              i = 0xa0;
            }
            else if ((uint)i < 0xc0) {
              i = 0xc0;
            }
            else {
              if (0x15f < (uint)i) {
                this->miniCEs[(int)ce] = 1;
                goto LAB_0029090b;
              }
              i = i + 0x20;
            }
            ce._4_4_ = 0;
            sec = uVar3;
          }
          if (0x500 < ((uint)iVar5 & 0x3f3f)) {
            if (6 < ce._4_4_) {
              this->miniCEs[(int)ce] = 1;
              goto LAB_0029090b;
            }
            ce._4_4_ = ce._4_4_ + 1;
          }
          if ((ter < 0xc00) || (0xff8 < ter)) {
            this->miniCEs[(int)ce] = (ushort)ter | (ushort)i | (ushort)ce._4_4_;
          }
          else {
            this->miniCEs[(int)ce] = (ushort)ter | (ushort)ce._4_4_;
          }
        }
        else {
          while (prevSecondary < uVar3) {
            UnicodeString::setCharAt(&this->result,prevPrimary + 1,(UChar)ter);
            prevPrimary = prevPrimary + 1;
            if (3 < (int)prevPrimary) {
              prevSecondary = 0xffffffff;
              break;
            }
            prevSecondary = this->lastSpecialPrimaries[(int)prevPrimary];
          }
          if (this->firstShortPrimary <= uVar3) {
            if (ter < 0x1000) {
              ter = 0x1000;
            }
            else {
              if (0xf7ff < ter) {
                this->shortPrimaryOverflow = '\x01';
                this->miniCEs[(int)ce] = 1;
                goto LAB_0029090b;
              }
              ter = ter + 0x400;
            }
LAB_00290739:
            sec = 0x500;
            i = 0xa0;
            ce._4_4_ = 0;
            pri = uVar3;
            goto LAB_00290754;
          }
          if (ter == 0) {
            ter = 0xc00;
            goto LAB_00290739;
          }
          if (ter < 0xff8) {
            ter = ter + 8;
            goto LAB_00290739;
          }
          this->miniCEs[(int)ce] = 1;
        }
LAB_0029090b:
      }
      this_local._7_1_ = ::U_SUCCESS(*errorCode);
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::encodeUniqueCEs(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    uprv_free(miniCEs);
    miniCEs = (uint16_t *)uprv_malloc(uniqueCEs.size() * 2);
    if(miniCEs == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    int32_t group = 0;
    uint32_t lastGroupPrimary = lastSpecialPrimaries[group];
    // The lowest unique CE must be at least a secondary CE.
    U_ASSERT(((uint32_t)uniqueCEs.elementAti(0) >> 16) != 0);
    uint32_t prevPrimary = 0;
    uint32_t prevSecondary = 0;
    uint32_t pri = 0;
    uint32_t sec = 0;
    uint32_t ter = CollationFastLatin::COMMON_TER;
    for(int32_t i = 0; i < uniqueCEs.size(); ++i) {
        int64_t ce = uniqueCEs.elementAti(i);
        // Note: At least one of the p/s/t weights changes from one unique CE to the next.
        // (uniqueCEs does not store case bits.)
        uint32_t p = (uint32_t)(ce >> 32);
        if(p != prevPrimary) {
            while(p > lastGroupPrimary) {
                U_ASSERT(pri <= CollationFastLatin::MAX_LONG);
                // Set the group's header entry to the
                // last "long primary" in or before the group.
                result.setCharAt(1 + group, (UChar)pri);
                if(++group < NUM_SPECIAL_GROUPS) {
                    lastGroupPrimary = lastSpecialPrimaries[group];
                } else {
                    lastGroupPrimary = 0xffffffff;
                    break;
                }
            }
            if(p < firstShortPrimary) {
                if(pri == 0) {
                    pri = CollationFastLatin::MIN_LONG;
                } else if(pri < CollationFastLatin::MAX_LONG) {
                    pri += CollationFastLatin::LONG_INC;
                } else {
#if DEBUG_COLLATION_FAST_LATIN_BUILDER
                    printf("long-primary overflow for %08x\n", p);
#endif
                    miniCEs[i] = CollationFastLatin::BAIL_OUT;
                    continue;
                }
            } else {
                if(pri < CollationFastLatin::MIN_SHORT) {
                    pri = CollationFastLatin::MIN_SHORT;
                } else if(pri < (CollationFastLatin::MAX_SHORT - CollationFastLatin::SHORT_INC)) {
                    // Reserve the highest primary weight for U+FFFF.
                    pri += CollationFastLatin::SHORT_INC;
                } else {
#if DEBUG_COLLATION_FAST_LATIN_BUILDER
                    printf("short-primary overflow for %08x\n", p);
#endif
                    shortPrimaryOverflow = TRUE;
                    miniCEs[i] = CollationFastLatin::BAIL_OUT;
                    continue;
                }
            }
            prevPrimary = p;
            prevSecondary = Collation::COMMON_WEIGHT16;
            sec = CollationFastLatin::COMMON_SEC;
            ter = CollationFastLatin::COMMON_TER;
        }
        uint32_t lower32 = (uint32_t)ce;
        uint32_t s = lower32 >> 16;
        if(s != prevSecondary) {
            if(pri == 0) {
                if(sec == 0) {
                    sec = CollationFastLatin::MIN_SEC_HIGH;
                } else if(sec < CollationFastLatin::MAX_SEC_HIGH) {
                    sec += CollationFastLatin::SEC_INC;
                } else {
                    miniCEs[i] = CollationFastLatin::BAIL_OUT;
                    continue;
                }
                prevSecondary = s;
                ter = CollationFastLatin::COMMON_TER;
            } else if(s < Collation::COMMON_WEIGHT16) {
                if(sec == CollationFastLatin::COMMON_SEC) {
                    sec = CollationFastLatin::MIN_SEC_BEFORE;
                } else if(sec < CollationFastLatin::MAX_SEC_BEFORE) {
                    sec += CollationFastLatin::SEC_INC;
                } else {
                    miniCEs[i] = CollationFastLatin::BAIL_OUT;
                    continue;
                }
            } else if(s == Collation::COMMON_WEIGHT16) {
                sec = CollationFastLatin::COMMON_SEC;
            } else {
                if(sec < CollationFastLatin::MIN_SEC_AFTER) {
                    sec = CollationFastLatin::MIN_SEC_AFTER;
                } else if(sec < CollationFastLatin::MAX_SEC_AFTER) {
                    sec += CollationFastLatin::SEC_INC;
                } else {
                    miniCEs[i] = CollationFastLatin::BAIL_OUT;
                    continue;
                }
            }
            prevSecondary = s;
            ter = CollationFastLatin::COMMON_TER;
        }
        U_ASSERT((lower32 & Collation::CASE_MASK) == 0);  // blanked out in uniqueCEs
        uint32_t t = lower32 & Collation::ONLY_TERTIARY_MASK;
        if(t > Collation::COMMON_WEIGHT16) {
            if(ter < CollationFastLatin::MAX_TER_AFTER) {
                ++ter;
            } else {
                miniCEs[i] = CollationFastLatin::BAIL_OUT;
                continue;
            }
        }
        if(CollationFastLatin::MIN_LONG <= pri && pri <= CollationFastLatin::MAX_LONG) {
            U_ASSERT(sec == CollationFastLatin::COMMON_SEC);
            miniCEs[i] = (uint16_t)(pri | ter);
        } else {
            miniCEs[i] = (uint16_t)(pri | sec | ter);
        }
    }
#if DEBUG_COLLATION_FAST_LATIN_BUILDER
    printf("last mini primary: %04x\n", pri);
#endif
#if DEBUG_COLLATION_FAST_LATIN_BUILDER >= 2
    for(int32_t i = 0; i < uniqueCEs.size(); ++i) {
        int64_t ce = uniqueCEs.elementAti(i);
        printf("unique CE 0x%016lx -> 0x%04x\n", ce, miniCEs[i]);
    }
#endif
    return U_SUCCESS(errorCode);
}